

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall jaegertracing::net::Socket::listen(Socket *this,int __fd,int __n)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  int returnCode;
  int backlog_local;
  Socket *this_local;
  
  iVar1 = ::listen(this->_handle,__fd);
  if (iVar1 != 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,iVar1,__ecat,"Failed to listen on socket");
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return 0;
}

Assistant:

void listen(int backlog = kDefaultBacklog)
    {
        const auto returnCode = ::listen(_handle, backlog);
        if (returnCode != 0) {
            throw std::system_error(
                errno, std::system_category(), "Failed to listen on socket");
        }
    }